

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

int gmfstatkwdf77_(int64_t *MshIdx,int *KwdIdx,int *NmbTyp,int *SolSiz,int *TypTab,int *deg,
                  int *NmbNod)

{
  int KwdCod;
  char *pcVar1;
  int64_t iVar2;
  
  KwdCod = *KwdIdx;
  pcVar1 = GmfKwdFmt[KwdCod][2];
  if (*pcVar1 == 's') {
    if ((pcVar1[1] == 'r') && (pcVar1[2] == '\0')) {
      iVar2 = GmfStatKwd(*MshIdx,KwdCod);
      return (int)iVar2;
    }
  }
  else if (((*pcVar1 == 'h') && (pcVar1[1] == 'r')) && (pcVar1[2] == '\0')) {
    iVar2 = GmfStatKwd(*MshIdx,KwdCod);
    return (int)iVar2;
  }
  iVar2 = GmfStatKwd(*MshIdx,KwdCod);
  return (int)iVar2;
}

Assistant:

int APIF77(gmfstatkwdf77)( int64_t *MshIdx, int *KwdIdx, int *NmbTyp,
                           int *SolSiz, int *TypTab, int *deg, int *NmbNod )
{
   if(!strcmp(GmfKwdFmt[ *KwdIdx ][2], "hr"))
      return(GmfStatKwd(*MshIdx, *KwdIdx, NmbTyp, SolSiz, TypTab, deg, NmbNod));
   else if(!strcmp(GmfKwdFmt[ *KwdIdx ][2], "sr"))
      return(GmfStatKwd(*MshIdx, *KwdIdx, NmbTyp, SolSiz, TypTab));
   else
      return(GmfStatKwd(*MshIdx, *KwdIdx));
}